

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

bool __thiscall
S2Builder::Graph::GetLeftTurnMap
          (Graph *this,vector<int,_std::allocator<int>_> *in_edge_ids,
          vector<int,_std::allocator<int>_> *left_turn_map,S2Error *error)

{
  pointer *ppiVar1;
  value_type vVar2;
  anon_class_16_3_61813810 __comp;
  bool bVar3;
  EdgeId EVar4;
  const_reference pvVar5;
  pair<int,_int> *ppVar6;
  reference pvVar7;
  reference pvVar8;
  iterator __last;
  reference pVVar9;
  iterator __first;
  iterator __last_00;
  byte local_211;
  Edge local_1c8;
  Edge *local_1a0;
  VertexEdge *e;
  iterator __end2;
  iterator __begin2;
  vector<VertexEdge,_std::allocator<VertexEdge>_> *__range2;
  __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_> local_100;
  __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_> local_f8;
  VertexId local_ec;
  Edge EStack_e8;
  VertexId min_endpoint;
  Edge local_e0;
  EdgeId local_d8;
  EdgeId local_d4;
  int in_begin;
  int out_begin;
  VertexId v1;
  VertexId v0;
  pair<int,_int> local_c0;
  Edge min_edge;
  pair<int,_int> local_b0;
  Edge sentinel;
  Edge *in_edge;
  Edge *local_90;
  Edge *out_edge;
  int in;
  int out;
  vector<int,_std::allocator<int>_> e_out;
  vector<int,_std::allocator<int>_> e_in;
  vector<VertexEdge,_std::allocator<VertexEdge>_> v0_edges;
  S2Error *error_local;
  vector<int,_std::allocator<int>_> *left_turn_map_local;
  vector<int,_std::allocator<int>_> *in_edge_ids_local;
  Graph *this_local;
  
  EVar4 = num_edges(this);
  v0_edges.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::assign
            (left_turn_map,(long)EVar4,
             (value_type_conflict1 *)
             ((long)&v0_edges.super__Vector_base<VertexEdge,_std::allocator<VertexEdge>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  EVar4 = num_edges(this);
  if (EVar4 == 0) {
    this_local._7_1_ = true;
  }
  else {
    std::vector<VertexEdge,_std::allocator<VertexEdge>_>::vector
              ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)
               &e_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&in);
    out_edge._4_4_ = 0;
    out_edge._0_4_ = 0;
    local_90 = edge(this,0);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_edge_ids,0);
    sentinel = (Edge)edge(this,*pvVar5);
    min_edge.second = num_vertices(this);
    min_edge.first = num_vertices(this);
    std::pair<int,_int>::pair<int,_int,_true>(&local_b0,&min_edge.second,&min_edge.first);
    _v1 = reverse((Edge *)sentinel);
    ppVar6 = std::min<std::pair<int,int>>(local_90,(pair<int,_int> *)&v1);
    local_c0 = *ppVar6;
    while (bVar3 = std::operator!=(&local_c0,&local_b0), bVar3) {
      out_begin = local_c0.first;
      while (local_c0.first == out_begin) {
        in_begin = local_c0.second;
        local_d4 = out_edge._4_4_;
        local_d8 = (int)out_edge;
        while (bVar3 = std::operator==(local_90,&local_c0), bVar3) {
          out_edge._4_4_ = out_edge._4_4_ + 1;
          EVar4 = num_edges(this);
          if (out_edge._4_4_ == EVar4) {
            local_1a0 = &local_b0;
          }
          else {
            local_1a0 = edge(this,out_edge._4_4_);
          }
          local_90 = local_1a0;
        }
        while( true ) {
          local_e0 = reverse((Edge *)sentinel);
          bVar3 = std::operator==(&local_e0,&local_c0);
          if (!bVar3) break;
          out_edge._0_4_ = (int)out_edge + 1;
          EVar4 = num_edges(this);
          if ((int)out_edge == EVar4) {
            local_1c8 = (Edge)&local_b0;
          }
          else {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_edge_ids,(long)(int)out_edge);
            local_1c8 = (Edge)edge(this,*pvVar5);
          }
          sentinel = local_1c8;
        }
        if (out_begin == in_begin) {
          for (; EVar4 = local_d8, local_d8 < (int)out_edge; local_d8 = local_d8 + 1) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (left_turn_map,(long)local_d8);
            *pvVar7 = EVar4;
          }
        }
        else {
          AddVertexEdges(local_d4,out_edge._4_4_,local_d8,(int)out_edge,in_begin,
                         (vector<VertexEdge,_std::allocator<VertexEdge>_> *)
                         &e_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        }
        EStack_e8 = reverse((Edge *)sentinel);
        ppVar6 = std::min<std::pair<int,int>>(local_90,&stack0xffffffffffffff18);
        std::pair<int,_int>::operator=(&local_c0,ppVar6);
      }
      bVar3 = std::vector<VertexEdge,_std::allocator<VertexEdge>_>::empty
                        ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)
                         &e_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (!bVar3) {
        ppiVar1 = &e_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pvVar8 = std::vector<VertexEdge,_std::allocator<VertexEdge>_>::front
                           ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)ppiVar1);
        local_ec = pvVar8->endpoint;
        local_100._M_current =
             (VertexEdge *)
             std::vector<VertexEdge,_std::allocator<VertexEdge>_>::begin
                       ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)ppiVar1);
        local_f8 = __gnu_cxx::
                   __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                   ::operator+(&local_100,1);
        __last = std::vector<VertexEdge,_std::allocator<VertexEdge>_>::end
                           ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)ppiVar1);
        __comp.min_endpoint = local_ec;
        __comp.v0 = out_begin;
        __comp.this = this;
        std::
        sort<__gnu_cxx::__normal_iterator<VertexEdge*,std::vector<VertexEdge,std::allocator<VertexEdge>>>,S2Builder::Graph::GetLeftTurnMap(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>*,S2Error*)const::__0>
                  (local_f8,(__normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                             )__last._M_current,__comp);
        ppiVar1 = &e_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        __end2 = std::vector<VertexEdge,_std::allocator<VertexEdge>_>::begin
                           ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)ppiVar1);
        e = (VertexEdge *)
            std::vector<VertexEdge,_std::allocator<VertexEdge>_>::end
                      ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)ppiVar1);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                                           *)&e), bVar3) {
          pVVar9 = __gnu_cxx::
                   __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>
                   ::operator*(&__end2);
          if ((pVVar9->incoming & 1U) == 0) {
            bVar3 = std::vector<int,_std::allocator<int>_>::empty
                              ((vector<int,_std::allocator<int>_> *)
                               &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            if (bVar3) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&in,&pVVar9->index);
            }
            else {
              EVar4 = pVVar9->index;
              pvVar7 = std::vector<int,_std::allocator<int>_>::back
                                 ((vector<int,_std::allocator<int>_> *)
                                  &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (left_turn_map,(long)*pvVar7);
              *pvVar7 = EVar4;
              std::vector<int,_std::allocator<int>_>::pop_back
                        ((vector<int,_std::allocator<int>_> *)
                         &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
            }
          }
          else {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_edge_ids,(long)pVVar9->index);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,pvVar5);
          }
          __gnu_cxx::
          __normal_iterator<VertexEdge_*,_std::vector<VertexEdge,_std::allocator<VertexEdge>_>_>::
          operator++(&__end2);
        }
        __first = std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&in);
        __last_00 = std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)&in);
        std::reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   __first._M_current,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   __last_00._M_current);
        while( true ) {
          bVar3 = std::vector<int,_std::allocator<int>_>::empty
                            ((vector<int,_std::allocator<int>_> *)&in);
          local_211 = 0;
          if (!bVar3) {
            bVar3 = std::vector<int,_std::allocator<int>_>::empty
                              ((vector<int,_std::allocator<int>_> *)
                               &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            local_211 = bVar3 ^ 0xff;
          }
          if ((local_211 & 1) == 0) break;
          pvVar7 = std::vector<int,_std::allocator<int>_>::back
                             ((vector<int,_std::allocator<int>_> *)&in);
          vVar2 = *pvVar7;
          pvVar7 = std::vector<int,_std::allocator<int>_>::back
                             ((vector<int,_std::allocator<int>_> *)
                              &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](left_turn_map,(long)*pvVar7);
          *pvVar7 = vVar2;
          std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)&in)
          ;
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)
                     &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        bVar3 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)
                           &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if ((!bVar3) && (bVar3 = S2Error::ok(error), bVar3)) {
          S2Error::Init(error,BUILDER_EDGES_DO_NOT_FORM_LOOPS,
                        "Given edges do not form loops (indegree != outdegree)");
        }
        std::vector<int,_std::allocator<int>_>::clear
                  ((vector<int,_std::allocator<int>_> *)
                   &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&in);
        std::vector<VertexEdge,_std::allocator<VertexEdge>_>::clear
                  ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)
                   &e_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    this_local._7_1_ = S2Error::ok(error);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&in);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &e_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<VertexEdge,_std::allocator<VertexEdge>_>::~vector
              ((vector<VertexEdge,_std::allocator<VertexEdge>_> *)
               &e_in.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  return this_local._7_1_;
}

Assistant:

bool Graph::GetLeftTurnMap(const vector<EdgeId>& in_edge_ids,
                           vector<EdgeId>* left_turn_map,
                           S2Error* error) const {
  left_turn_map->assign(num_edges(), -1);
  if (num_edges() == 0) return true;

  // Declare vectors outside the loop to avoid reallocating them each time.
  vector<VertexEdge> v0_edges;
  vector<EdgeId> e_in, e_out;

  // Walk through the two sorted arrays of edges (outgoing and incoming) and
  // gather all the edges incident to each vertex.  Then we sort those edges
  // and add an entry to the left turn map from each incoming edge to the
  // immediately following outgoing edge in clockwise order.
  int out = 0, in = 0;
  const Edge* out_edge = &edge(out);
  const Edge* in_edge = &edge(in_edge_ids[in]);
  Edge sentinel(num_vertices(), num_vertices());
  Edge min_edge = min(*out_edge, reverse(*in_edge));
  while (min_edge != sentinel) {
    // Gather all incoming and outgoing edges around vertex "v0".
    VertexId v0 = min_edge.first;
    for (; min_edge.first == v0; min_edge = min(*out_edge, reverse(*in_edge))) {
      VertexId v1 = min_edge.second;
      // Count the number of copies of "min_edge" in each direction.
      int out_begin = out, in_begin = in;
      while (*out_edge == min_edge) {
        out_edge = (++out == num_edges()) ? &sentinel : &edge(out);
      }
      while (reverse(*in_edge) == min_edge) {
        in_edge = (++in == num_edges()) ? &sentinel : &edge(in_edge_ids[in]);
      }
      if (v0 != v1) {
        AddVertexEdges(out_begin, out, in_begin, in, v1, &v0_edges);
      } else {
        // Each degenerate edge becomes its own loop.
        for (; in_begin < in; ++in_begin) {
          (*left_turn_map)[in_begin] = in_begin;
        }
      }
    }
    if (v0_edges.empty()) continue;

    // Sort the edges in clockwise order around "v0".
    VertexId min_endpoint = v0_edges.front().endpoint;
    std::sort(v0_edges.begin() + 1, v0_edges.end(),
              [v0, min_endpoint, this](const VertexEdge& a,
                                       const VertexEdge& b) {
        if (a.endpoint == b.endpoint) return a.rank < b.rank;
        if (a.endpoint == min_endpoint) return true;
        if (b.endpoint == min_endpoint) return false;
        return !s2pred::OrderedCCW(vertex(a.endpoint), vertex(b.endpoint),
                                   vertex(min_endpoint), vertex(v0));
      });
    // Match incoming with outgoing edges.  We do this by keeping a stack of
    // unmatched incoming edges.  We also keep a stack of outgoing edges with
    // no previous incoming edge, and match these at the end by wrapping
    // around circularly to the start of the edge ordering.
    for (const VertexEdge& e : v0_edges) {
      if (e.incoming) {
        e_in.push_back(in_edge_ids[e.index]);
      } else if (!e_in.empty()) {
        (*left_turn_map)[e_in.back()] = e.index;
        e_in.pop_back();
      } else {
        e_out.push_back(e.index);  // Matched below.
      }
    }
    // Pair up additional edges using the fact that the ordering is circular.
    std::reverse(e_out.begin(), e_out.end());
    for (; !e_out.empty() && !e_in.empty(); e_out.pop_back(), e_in.pop_back()) {
      (*left_turn_map)[e_in.back()] = e_out.back();
    }
    // We only need to process unmatched incoming edges, since we are only
    // responsible for creating left turn map entries for those edges.
    if (!e_in.empty() && error->ok()) {
      error->Init(S2Error::BUILDER_EDGES_DO_NOT_FORM_LOOPS,
                  "Given edges do not form loops (indegree != outdegree)");
    }
    e_in.clear();
    e_out.clear();
    v0_edges.clear();
  }
  return error->ok();
}